

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

QSize __thiscall QSlider::minimumSizeHint(QSlider *this)

{
  QSliderPrivate *pQVar1;
  QSize QVar2;
  QStyle *pQVar3;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int length;
  QSliderPrivate *d;
  QSize s;
  QStyleOptionSlider opt;
  QWidget *in_stack_ffffffffffffff48;
  int h;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSlider *)0x683b90);
  QVar2 = (QSize)(**(code **)((long)*in_RDI + 0x70))();
  memcpy(local_88,&DAT_00b22c00,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x683bd1);
  (**(code **)((long)*in_RDI + 0x1a8))(in_RDI,local_88);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff48);
  h = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0xd,local_88,in_RDI);
  if ((pQVar1->super_QAbstractSliderPrivate).orientation == Horizontal) {
    QSize::setWidth(in_RDI,h);
  }
  else {
    QSize::setHeight(in_RDI,h);
  }
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x683c43);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSlider::minimumSizeHint() const
{
    Q_D(const QSlider);
    QSize s = sizeHint();
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    int length = style()->pixelMetric(QStyle::PM_SliderLength, &opt, this);
    if (d->orientation == Qt::Horizontal)
        s.setWidth(length);
    else
        s.setHeight(length);
    return s;
}